

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O3

DisplayAction * setLineWidth(DisplayAction *__return_storage_ptr__,int width)

{
  offset_in_Display_to_subr in_R9;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  local_38 = 0;
  uStack_30 = 0;
  DisplayAction::DisplayAction(__return_storage_ptr__,width,&local_58,0,0,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setLineWidth( const int width )
{
    return DisplayAction(width, "", 0, &Display::setLineWidth, 0);
}